

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrNoCaseEqual
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  TestResult *pTVar6;
  SimpleString local_158;
  StringEqualNoCaseFailure local_148;
  SimpleString local_e0;
  SimpleString local_d0 [2];
  SimpleString local_b0;
  StringEqualNoCaseFailure local_a0;
  size_t local_38;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  char *actual_local;
  char *expected_local;
  UtestShell *this_local;
  
  local_38 = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = actual;
  actual_local = expected;
  expected_local = (char *)this;
  pTVar6 = getTestResult(this);
  (*pTVar6->_vptr_TestResult[10])();
  pcVar4 = actual_local;
  pcVar3 = text_local;
  sVar2 = lineNumber_local;
  sVar1 = local_38;
  if ((text_local != (char *)0x0) || (actual_local != (char *)0x0)) {
    if ((text_local == (char *)0x0) || (actual_local == (char *)0x0)) {
      SimpleString::SimpleString(&local_b0,fileName_local);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                (&local_a0,this,(char *)sVar2,sVar1,pcVar4,pcVar3,&local_b0);
      (*this->_vptr_UtestShell[0x26])(this,&local_a0);
      StringEqualNoCaseFailure::~StringEqualNoCaseFailure(&local_a0);
      SimpleString::~SimpleString(&local_b0);
    }
    SimpleString::SimpleString(local_d0,actual_local);
    SimpleString::SimpleString(&local_e0,text_local);
    bVar5 = SimpleString::equalsNoCase(local_d0,&local_e0);
    SimpleString::~SimpleString(&local_e0);
    SimpleString::~SimpleString(local_d0);
    pcVar4 = actual_local;
    pcVar3 = text_local;
    sVar2 = lineNumber_local;
    sVar1 = local_38;
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      SimpleString::SimpleString(&local_158,fileName_local);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                (&local_148,this,(char *)sVar2,sVar1,pcVar4,pcVar3,&local_158);
      (*this->_vptr_UtestShell[0x26])(this,&local_148);
      StringEqualNoCaseFailure::~StringEqualNoCaseFailure(&local_148);
      SimpleString::~SimpleString(&local_158);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseEqual(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(expected).equalsNoCase(actual))
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
}